

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::SetRPath(string *file,string *newRPath,string *emsg,bool *changed)

{
  optional<bool> oVar1;
  string *this;
  _Storage<bool,_true> _Var2;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
  local_70;
  anon_class_32_1_393cdf75 adjustCallback;
  
  std::__cxx11::string::string((string *)&adjustCallback,(string *)newRPath);
  anon_unknown.dwarf_f7d1a::MakeEmptyCallback(&local_70,newRPath);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  this = (string *)operator_new(0x20);
  std::__cxx11::string::string(this,(string *)&adjustCallback);
  pcStack_80 = std::
               _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:3025:25)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSystemTools.cxx:3025:25)>
             ::_M_manager;
  local_98._M_unused._0_8_ = (undefined8)this;
  oVar1 = anon_unknown.dwarf_f7d1a::AdjustRPathELF
                    (file,&local_70,(AdjustCallback *)&local_98,emsg,changed);
  _Var2._M_value =
       oVar1.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
       _M_payload;
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  std::__cxx11::string::~string((string *)&adjustCallback);
  if (((ushort)oVar1.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) == 0) {
    if (newRPath->_M_string_length == 0) {
      _Var2._M_value = true;
    }
    else {
      if (emsg != (string *)0x0) {
        std::__cxx11::string::assign((char *)emsg);
      }
      _Var2._M_value = false;
    }
  }
  return (bool)(_Var2._M_value & 1);
}

Assistant:

bool cmSystemTools::SetRPath(std::string const& file,
                             std::string const& newRPath, std::string* emsg,
                             bool* changed)
{
  if (cm::optional<bool> result = SetRPathELF(file, newRPath, emsg, changed)) {
    return result.value();
  }
  if (cm::optional<bool> result =
        SetRPathXCOFF(file, newRPath, emsg, changed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  if (newRPath.empty()) {
    // The caller wanted no RPATH anyway.
    return true;
  }
  if (emsg) {
    *emsg = "The file format is not recognized.";
  }
  return false;
}